

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall
RpiControlCore::process_package
          (string *__return_storage_ptr__,RpiControlCore *this,string *header,string *message)

{
  undefined8 uVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  char *pcVar5;
  DeviceProperties *this_00;
  ulong uVar6;
  char *cmd;
  char *cmd_00;
  string local_650;
  allocator<char> local_629;
  string local_628;
  string local_608;
  string local_5e8 [39];
  allocator<char> local_5c1;
  string local_5c0;
  string local_5a0;
  string local_580;
  allocator<char> local_559;
  string local_558;
  string local_538;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  string local_428;
  allocator<char> local_401;
  string local_400;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator<char> local_399;
  string local_398;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  string local_2a8;
  string local_288;
  allocator<char> local_261;
  string local_260;
  string local_240;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> answer;
  DeviceProperties *d;
  string local_80;
  string local_60;
  undefined1 local_29;
  string *local_28;
  string *message_local;
  string *header_local;
  RpiControlCore *this_local;
  string *response;
  
  local_29 = 0;
  local_28 = message;
  message_local = header;
  header_local = (string *)this;
  this_local = (RpiControlCore *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar5 = (char *)std::__cxx11::string::data();
  uVar4 = sw_str(pcVar5,0);
  if (uVar4 == 0x9671e158) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"get-file",&local_559);
    init_response(&local_538,&local_558);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
    get_file(&local_580,local_28);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_580);
    std::__cxx11::string::~string((string *)&local_580);
  }
  else if (uVar4 == 0x9cf09c18) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"shutdown-device",&local_489);
    init_response(&local_468,&local_488);
    std::operator+(&local_448,&local_468,"OK");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
    Utils::exec_abi_cxx11_(&local_4b0,(Utils *)"sudo shutdown",cmd_00);
    std::__cxx11::string::~string((string *)&local_4b0);
  }
  else if (uVar4 == 0xac267199) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"exec-cmd",&local_629);
    init_response(&local_608,&local_628);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    run_cmd(&local_650,local_28);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_650);
    std::__cxx11::string::~string((string *)&local_650);
  }
  else if (uVar4 == 0xb06ebfb1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"set-device-name",&local_401);
    init_response(&local_3e0,&local_400);
    std::operator+(&local_3c0,&local_3e0,"OK");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    Utils::exec_abi_cxx11_(&local_428,(Utils *)"sudo reboot",cmd);
    std::__cxx11::string::~string((string *)&local_428);
  }
  else if (uVar4 == 0xb99b90dc) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c0,"get-eth-connection",&local_5c1);
    init_response(&local_5a0,&local_5c0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
    get_eth_connection_abi_cxx11_();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_5e8);
    std::__cxx11::string::~string(local_5e8);
  }
  else if (uVar4 == 0xd07a872c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"set-sound-volume",&local_2c9);
    init_response(&local_2a8,&local_2c8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    uVar6 = strtoul(pcVar5,(char **)0x0,0);
    set_sound_volume((unsigned_short)uVar6);
    uVar3 = get_sound_volume();
    std::__cxx11::to_string(&local_2f0,(uint)uVar3);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  else if (uVar4 == 0xd07a8738) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"get-sound-volume",&local_261);
    init_response(&local_240,&local_260);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    uVar3 = get_sound_volume();
    std::__cxx11::to_string(&local_288,(uint)uVar3);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
  }
  else if (uVar4 == 0x3c2a7b98) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"set-device-name",&local_331);
    init_response(&local_310,&local_330);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator(&local_331);
    set_device_name(&local_358,local_28);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_358);
    std::__cxx11::string::~string((string *)&local_358);
  }
  else if (uVar4 == 0x446f1da4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"set-new-password",&local_399);
    init_response(&local_378,&local_398);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    bVar2 = change_password(local_28);
    pcVar5 = "false";
    if (bVar2) {
      pcVar5 = "true";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
  }
  else if (uVar4 == 0x52de5103) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"scanner",(allocator<char> *)((long)&d + 7));
    init_response(&local_60,&local_80);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&d + 7));
    bVar2 = std::operator==(local_28,"mikhnovich.oleg.rpicontrol");
    if (bVar2) {
      this_00 = (DeviceProperties *)operator_new(0xa0);
      DeviceProperties::DeviceProperties(this_00);
      answer.field_2._8_8_ = this_00;
      DeviceProperties::get_device_name_abi_cxx11_(&local_130,this_00);
      std::operator+(&local_110,&local_130,"|");
      DeviceProperties::get_device_model_abi_cxx11_
                (&local_150,(DeviceProperties *)answer.field_2._8_8_);
      std::operator+(&local_f0,&local_110,&local_150);
      std::operator+(&local_d0,&local_f0,"|");
      DeviceProperties::get_os_version_abi_cxx11_
                (&local_170,(DeviceProperties *)answer.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_d0,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      uVar1 = answer.field_2._8_8_;
      if (answer.field_2._8_8_ != 0) {
        DeviceProperties::~DeviceProperties((DeviceProperties *)answer.field_2._8_8_);
        operator_delete((void *)uVar1,0xa0);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ACCESS_DENY");
    }
  }
  else if (uVar4 == 0x6e044f21) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"get-dir",&local_4f1);
    init_response(&local_4d0,&local_4f0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    get_dir(&local_518,local_28);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_518);
    std::__cxx11::string::~string((string *)&local_518);
  }
  else if (uVar4 == 0x791c5b1e) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"device-info",&local_1f9);
    init_response(&local_1d8,&local_1f8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    get_device_info_abi_cxx11_();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_220);
    std::__cxx11::string::~string(local_220);
  }
  else if (uVar4 == 0x7c719bad) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"auth",&local_1b1);
    init_response(&local_190,&local_1b0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    bVar2 = auth_user(local_28);
    pcVar5 = "false";
    if (bVar2) {
      pcVar5 = "true";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RpiControlCore::process_package(std::string &header, std::string &message) {
    std::string response;

    switch (sw_str(header.data())) {
        case sw_str(H_SCANNER):
            response = init_response(H_SCANNER);
            if (message == PKG_MASK) {
                auto d = new DeviceProperties;
                auto answer = d->get_device_name() + "|" + d->get_device_model() + "|" + d->get_os_version();
                delete d;
                response += answer;
            } else {
                response += "ACCESS_DENY";
            }
            break;

        case sw_str(H_AUTH):
            response = init_response(H_AUTH);
            response += (auth_user(message)) ? "true" : "false";
            break;

        case sw_str(H_DEVICE_INFO):
            response = init_response(H_DEVICE_INFO);
            response += get_device_info();
            break;

        case sw_str(H_GET_SOUND_VOLUME):
            response = init_response(H_GET_SOUND_VOLUME);
            response += std::to_string(get_sound_volume());
            break;

        case sw_str(H_SET_SOUND_VOLUME):
            response = init_response(H_SET_SOUND_VOLUME);
            set_sound_volume(static_cast<unsigned short>( std::strtoul(message.c_str(), nullptr, 0)));
            response += std::to_string(get_sound_volume());
            break;

        case sw_str(H_SET_DEVICE_NAME):
            response = init_response(H_SET_DEVICE_NAME);
            response += set_device_name(message);
            break;

        case sw_str(H_SET_NEW_PASSWORD):
            response = init_response(H_SET_NEW_PASSWORD);
            response += (change_password(message)) ? "true" : "false";
            break;

        case sw_str(H_REBOOT_DEVICE):
            response = init_response(H_SET_DEVICE_NAME) + "OK";
            Utils::exec("sudo reboot");
            break;

        case sw_str(H_SHUTDOWN_DEVICE):
            response = init_response(H_SHUTDOWN_DEVICE) + "OK";
            Utils::exec("sudo shutdown");
            break;

        case sw_str(H_GET_DIR):
            response = init_response(H_GET_DIR);
            response += get_dir(message);
            break;

        case sw_str(H_GET_FILE):
            response = init_response(H_GET_FILE);
            response += get_file(message);
            break;

        case sw_str(H_GET_ETH_CONNECTION):
            response = init_response(H_GET_ETH_CONNECTION);
            response += get_eth_connection();
            break;

        case sw_str(H_EXEC_CMD):
            response = init_response(H_EXEC_CMD);
            response += run_cmd(message);
            break;

        default:
            break;
    }
    return response;
}